

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

PipelineFor<DynamicStruct> *
capnp::DynamicValue::Pipeline::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
          (PipelineFor<DynamicStruct> *__return_storage_ptr__,Pipeline *pipeline)

{
  bool bVar1;
  Pipeline *pPVar2;
  Fault local_58;
  Fault f;
  Type *local_48;
  undefined1 local_40 [8];
  DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> _kjCondition;
  Pipeline *pipeline_local;
  
  _kjCondition._32_8_ = pipeline;
  local_48 = (Type *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&pipeline->type);
  f.exception._4_4_ = 10;
  kj::_::DebugExpression<capnp::DynamicValue::Type&>::operator==
            ((DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *)local_40,
             (DebugExpression<capnp::DynamicValue::Type&> *)&local_48,
             (Type *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type&,capnp::DynamicValue::Type>&,char_const(&)[24]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x72c,FAILED,"pipeline.type == STRUCT","_kjCondition,\"Pipeline type mismatch.\"",
               (DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *)local_40,
               (char (*) [24])"Pipeline type mismatch.");
    kj::_::Debug::Fault::fatal(&local_58);
  }
  pPVar2 = kj::mv<capnp::DynamicStruct::Pipeline>((Pipeline *)(_kjCondition._32_8_ + 8));
  DynamicStruct::Pipeline::Pipeline(__return_storage_ptr__,pPVar2);
  return __return_storage_ptr__;
}

Assistant:

PipelineFor<DynamicStruct> DynamicValue::Pipeline::AsImpl<DynamicStruct>::apply(
    Pipeline& pipeline) {
  KJ_REQUIRE(pipeline.type == STRUCT, "Pipeline type mismatch.");
  return kj::mv(pipeline.structValue);
}